

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O0

void __thiscall
blcl::net::server_interface<MsgType>::broadcast_message
          (server_interface<MsgType> *this,message<MsgType> *msg,
          shared_ptr<blcl::net::connection<MsgType>_> *ignored_client)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  iterator local_180;
  iterator local_160;
  const_iterator local_140;
  void *local_120;
  iterator local_118;
  iterator local_f8;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_d8;
  const_iterator local_b8;
  shared_ptr<blcl::net::connection<MsgType>_> local_88;
  __shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<blcl::net::connection<MsgType>_> *client;
  iterator __end0;
  iterator __begin0;
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  *__range3;
  bool invalid_client_exists;
  shared_ptr<blcl::net::connection<MsgType>_> *ignored_client_local;
  message<MsgType> *msg_local;
  server_interface<MsgType> *this_local;
  
  bVar1 = false;
  std::
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::begin((iterator *)&__end0._M_node,&this->connections_);
  std::
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::end((iterator *)&client,&this->connections_);
  do {
    bVar2 = std::operator==((_Self *)&__end0._M_node,(_Self *)&client);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if (bVar1) {
        std::
        deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
        ::begin(&local_f8,&this->connections_);
        std::
        deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
        ::end(&local_118,&this->connections_);
        local_120 = (void *)0x0;
        std::
        remove<std::_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>&,std::shared_ptr<blcl::net::connection<MsgType>>*>,decltype(nullptr)>
                  (&local_d8,&local_f8,&local_118,&local_120);
        std::
        _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>const&,std::shared_ptr<blcl::net::connection<MsgType>>const*>
        ::
        _Deque_iterator<std::_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>&,std::shared_ptr<blcl::net::connection<MsgType>>*>,void>
                  ((_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>const&,std::shared_ptr<blcl::net::connection<MsgType>>const*>
                    *)&local_b8,&local_d8);
        std::
        deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
        ::end(&local_160,&this->connections_);
        std::
        _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>const&,std::shared_ptr<blcl::net::connection<MsgType>>const*>
        ::
        _Deque_iterator<std::_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>&,std::shared_ptr<blcl::net::connection<MsgType>>*>,void>
                  ((_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>const&,std::shared_ptr<blcl::net::connection<MsgType>>const*>
                    *)&local_140,&local_160);
        std::
        deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
        ::erase(&local_180,&this->connections_,&local_b8,&local_140);
      }
      return;
    }
    local_78 = &std::
                _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
                ::operator*((_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
                             *)&__end0._M_node)->
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
      bVar2 = connection<MsgType>::is_connected(peVar3);
      if (!bVar2) goto LAB_00123112;
      bVar2 = std::operator==((shared_ptr<blcl::net::connection<MsgType>_> *)local_78,ignored_client
                             );
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        peVar3 = std::
                 __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_78);
        bVar2 = connection<MsgType>::is_validated(peVar3);
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
          connection<MsgType>::send(peVar3,(int)msg,__buf,in_RCX,in_R8D);
        }
      }
    }
    else {
LAB_00123112:
      std::shared_ptr<blcl::net::connection<MsgType>_>::shared_ptr
                (&local_88,(shared_ptr<blcl::net::connection<MsgType>_> *)local_78);
      (*this->_vptr_server_interface[3])(this,&local_88);
      std::shared_ptr<blcl::net::connection<MsgType>_>::~shared_ptr(&local_88);
      std::__shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>::reset(local_78)
      ;
      bVar1 = true;
    }
    std::
    _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
    ::operator++((_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
                  *)&__end0._M_node);
  } while( true );
}

Assistant:

void broadcast_message(const message<T>& msg, std::shared_ptr<connection<T>> ignored_client = nullptr) {
            bool invalid_client_exists = false;

            for (auto& client: connections_) {
                if (client && client->is_connected()) {
                    if (client != ignored_client && client->is_validated())
                        client->send(msg);
                } else {
                    on_client_disconnect(client);
                    client.reset();
                    invalid_client_exists = true;
                }
            }

            if (invalid_client_exists)
                connections_.erase(
                        std::remove(connections_.begin(), connections_.end(), nullptr), connections_.end());
        }